

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_StSlotPrimitive<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,_SIMDValue>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var pvVar1;
  undefined8 *puVar2;
  AsmJsSIMDValue AVar3;
  undefined8 local_30;
  undefined8 local_28;
  _SIMDValue *buffer;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = GetNonVarReg(this,(uint)playout->Instance);
  AVar3 = GetRegRaw<_SIMDValue>(this,(uint)playout->Value);
  puVar2 = (undefined8 *)((long)pvVar1 + (ulong)playout->SlotIndex * 0x10);
  local_30 = AVar3.field_0._0_8_;
  *puVar2 = local_30;
  local_28 = AVar3.field_0._8_8_;
  puVar2[1] = local_28;
  return;
}

Assistant:

void InterpreterStackFrame::OP_StSlotPrimitive(const unaligned T* playout)
    {
        T2* buffer = (T2*)GetNonVarReg(playout->Instance);
        buffer[playout->SlotIndex] = GetRegRaw<T2>(playout->Value);
    }